

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

TBuiltInParseables *
anon_unknown.dwarf_7f0079::CreateBuiltInParseables(TInfoSink *infoSink,EShSource source)

{
  TBuiltIns *this;
  undefined4 in_register_00000034;
  
  if (source == EShSourceHlsl) {
    this = (TBuiltIns *)
           glslang::TBuiltInParseablesHlsl::operator_new
                     ((TBuiltInParseablesHlsl *)0x260,CONCAT44(in_register_00000034,source));
    glslang::TBuiltInParseablesHlsl::TBuiltInParseablesHlsl((TBuiltInParseablesHlsl *)this);
  }
  else if (source == EShSourceGlsl) {
    this = (TBuiltIns *)
           glslang::TBuiltIns::operator_new
                     ((TBuiltIns *)0x390,CONCAT44(in_register_00000034,source));
    glslang::TBuiltIns::TBuiltIns(this);
  }
  else {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixInternalError,"Unable to determine source language");
    this = (TBuiltIns *)0x0;
  }
  return &this->super_TBuiltInParseables;
}

Assistant:

TBuiltInParseables* CreateBuiltInParseables(TInfoSink& infoSink, EShSource source)
{
    switch (source) {
    case EShSourceGlsl: return new TBuiltIns();              // GLSL builtIns
#ifdef ENABLE_HLSL
    case EShSourceHlsl: return new TBuiltInParseablesHlsl(); // HLSL intrinsics
#endif

    default:
        infoSink.info.message(EPrefixInternalError, "Unable to determine source language");
        return nullptr;
    }
}